

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

int If_DsdManCompute(If_DsdMan_t *p,word *pTruth,int nLeaves,uchar *pPerm,char *pLutStruct)

{
  int iVar1;
  void *pvVar2;
  word *pTruth_00;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  word *pwVar9;
  int nSupp;
  word pCopy [64];
  char pDsd [2000];
  int local_a1c;
  uchar *local_a18;
  word *local_a10;
  word local_a08 [64];
  char local_808 [2008];
  
  local_a1c = 0;
  uVar8 = 1 << ((char)nLeaves - 6U & 0x1f);
  if (nLeaves < 7) {
    uVar8 = 1;
  }
  if (0xc < nLeaves) {
    __assert_fail("nLeaves <= DAU_MAX_VAR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x816,"int If_DsdManCompute(If_DsdMan_t *, word *, int, unsigned char *, char *)"
                 );
  }
  if (0 < (int)uVar8) {
    memcpy(local_a08,pTruth,(ulong)uVar8 * 8);
  }
  pwVar9 = local_a08;
  iVar3 = Dau_DsdDecompose(pwVar9,nLeaves,0,1,local_808);
  if ((0 < iVar3) && (iVar1 = p->nVars, iVar3 != iVar1)) {
    if (iVar1 <= iVar3) {
      __assert_fail("nVarS < nVarB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0x47d,"void Abc_TtStretch6(word *, int, int)");
    }
    uVar4 = 1 << ((char)iVar3 - 6U & 0x1f);
    if (iVar3 < 7) {
      uVar4 = 1;
    }
    uVar5 = 1 << ((char)iVar1 - 6U & 0x1f);
    if (iVar1 < 7) {
      uVar5 = 1;
    }
    if (uVar4 != uVar5) {
      if ((int)uVar5 <= (int)uVar4) {
        __assert_fail("step < nWords",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                      ,0x482,"void Abc_TtStretch6(word *, int, int)");
      }
      if (0 < (int)uVar5) {
        lVar6 = 0;
        do {
          if (0 < (int)uVar4) {
            uVar7 = 0;
            do {
              pwVar9[uVar7] = local_a08[uVar7];
              uVar7 = uVar7 + 1;
            } while (uVar4 != uVar7);
          }
          lVar6 = lVar6 + (int)uVar4;
          pwVar9 = pwVar9 + (int)uVar4;
        } while (lVar6 < (long)(ulong)uVar5);
      }
    }
  }
  local_a10 = pTruth;
  memset(pPerm,0xff,(long)nLeaves);
  uVar4 = If_DsdManAddDsd(p,local_808,local_a08,pPerm,&local_a1c);
  if (local_a1c != nLeaves) {
    __assert_fail("nSupp == nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x821,"int If_DsdManCompute(If_DsdMan_t *, word *, int, unsigned char *, char *)"
                 );
  }
  pwVar9 = p->pTtElems[0xc];
  local_a18 = pPerm;
  If_DsdManComputeTruthPtr(p,uVar4,pPerm,pwVar9);
  pTruth_00 = local_a10;
  if (0 < (int)uVar8) {
    uVar7 = 0;
    do {
      if (pwVar9[uVar7] != local_a10[uVar7]) {
        putchar(10);
        puts("Verification failed!");
        puts(local_808);
        Dau_DsdPrintFromTruth(pTruth_00,nLeaves);
        Dau_DsdPrintFromTruth(pwVar9,nLeaves);
        If_DsdManPrintOne(_stdout,p,uVar4 >> 1,local_a18,1);
        putchar(10);
        break;
      }
      uVar7 = uVar7 + 1;
    } while (uVar8 != uVar7);
  }
  uVar8 = uVar4 >> 1;
  if ((int)uVar8 < (p->vObjs).nSize) {
    pvVar2 = (p->vObjs).pArray[uVar8];
    uVar5 = *(uint *)((long)pvVar2 + 4);
    if ((~uVar5 & 0x7fffe00) != 0) {
      *(uint *)((long)pvVar2 + 4) = uVar5 & 0xf80001ff | uVar5 + 0x200 & 0x7fffe00;
    }
    if ((int)uVar8 < (p->vObjs).nSize) {
      if ((*(uint *)((long)(p->vObjs).pArray[uVar8] + 4) >> 3 & 0x1f) != nLeaves) {
        __assert_fail("If_DsdVecLitSuppSize(&p->vObjs, iDsd) == nLeaves",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                      ,0x832,
                      "int If_DsdManCompute(If_DsdMan_t *, word *, int, unsigned char *, char *)");
      }
      return uVar4;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int If_DsdManCompute( If_DsdMan_t * p, word * pTruth, int nLeaves, unsigned char * pPerm, char * pLutStruct )
{
    word pCopy[DAU_MAX_WORD], * pRes;
    char pDsd[DAU_MAX_STR];
    int iDsd, nSizeNonDec, nSupp = 0;
    int nWords = Abc_TtWordNum(nLeaves);
//    abctime clk = 0;
    assert( nLeaves <= DAU_MAX_VAR );
    Abc_TtCopy( pCopy, pTruth, nWords, 0 );
//clk = Abc_Clock();
    nSizeNonDec = Dau_DsdDecompose( pCopy, nLeaves, 0, 1, pDsd );
//p->timeDsd += Abc_Clock() - clk;
    if ( nSizeNonDec > 0 )
        Abc_TtStretch6( pCopy, nSizeNonDec, p->nVars );
    memset( pPerm, 0xFF, (size_t)nLeaves );
//clk = Abc_Clock();
    iDsd = If_DsdManAddDsd( p, pDsd, pCopy, pPerm, &nSupp );
//p->timeCanon += Abc_Clock() - clk;
    assert( nSupp == nLeaves );
    // verify the result
//clk = Abc_Clock();
    pRes = If_DsdManComputeTruth( p, iDsd, pPerm );
//p->timeVerify += Abc_Clock() - clk;
    if ( !Abc_TtEqual(pRes, pTruth, nWords) )
    {
//        If_DsdManPrint( p, NULL );
        printf( "\n" );
        printf( "Verification failed!\n" );
        printf( "%s\n", pDsd );
        Dau_DsdPrintFromTruth( pTruth, nLeaves );
        Dau_DsdPrintFromTruth( pRes, nLeaves );
        If_DsdManPrintOne( stdout, p, Abc_Lit2Var(iDsd), pPerm, 1 );
        printf( "\n" );
    }
    If_DsdVecObjIncRef( &p->vObjs, Abc_Lit2Var(iDsd) );
    assert( If_DsdVecLitSuppSize(&p->vObjs, iDsd) == nLeaves );
    return iDsd;
}